

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFEFStreamObjectHelper::getSubtype_abi_cxx11_
          (string *__return_storage_ptr__,QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_a5;
  uint local_a4;
  undefined1 local_a0 [8];
  string n;
  string local_78 [48];
  undefined1 local_48 [32];
  undefined1 local_28 [8];
  QPDFObjectHandle val;
  QPDFEFStreamObjectHelper *this_local;
  
  val.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_48);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_48 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"/Subtype",(allocator<char> *)(n.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_28,(string *)(local_48 + 0x10));
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)(n.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_48 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_28);
  if (bVar1) {
    QPDFObjectHandle::getName_abi_cxx11_((string *)local_a0,(QPDFObjectHandle *)local_28);
    uVar2 = std::__cxx11::string::length();
    if (1 < uVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_a0);
    }
    local_a4 = (uint)(1 < uVar2);
    std::__cxx11::string::~string((string *)local_a0);
    if (local_a4 != 0) goto LAB_001d3826;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_a5);
  std::allocator<char>::~allocator(&local_a5);
  local_a4 = 1;
LAB_001d3826:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFEFStreamObjectHelper::getSubtype()
{
    auto val = oh().getDict().getKey("/Subtype");
    if (val.isName()) {
        auto n = val.getName();
        if (n.length() > 1) {
            return n.substr(1);
        }
    }
    return "";
}